

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::extAddPairwiseToSI16x8(Literal *__return_storage_ptr__,Literal *this)

{
  Type *other;
  int32_t iVar1;
  int32_t iVar2;
  Literal *in_RDX;
  Literal *this_00;
  long lVar3;
  Literal *this_01;
  undefined1 local_288 [8];
  LaneArray<8_*_2> lanes;
  LaneArray<8> result;
  
  this_01 = (Literal *)local_288;
  getLanes<signed_char,16>((LaneArray<16> *)this_01,(wasm *)this,in_RDX);
  memset(&lanes._M_elems[0xf].type,0,0xc0);
  other = &result._M_elems[7].type;
  for (lVar3 = 0; lVar3 != 0xc0; lVar3 = lVar3 + 0x18) {
    iVar1 = geti32(this_01);
    iVar2 = geti32(this_01 + 1);
    result._M_elems[7].type.id._0_4_ = (int)(char)iVar2 + (int)(char)iVar1;
    this_00 = (Literal *)((long)result._M_elems + lVar3 + -8);
    if (this_00 != (Literal *)other) {
      ~Literal(this_00);
      Literal(this_00,(Literal *)other);
    }
    ~Literal((Literal *)other);
    this_01 = this_01 + 2;
  }
  Literal(__return_storage_ptr__,(LaneArray<8> *)&lanes._M_elems[0xf].type);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)&lanes._M_elems[0xf].type);
  std::array<wasm::Literal,_16UL>::~array((array<wasm::Literal,_16UL> *)local_288);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::extAddPairwiseToSI16x8() const {
  return extAddPairwise<8, int8_t, int16_t>(*this);
}